

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

string * __thiscall
vkt::(anonymous_namespace)::getAttachmentType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat vkFormat)

{
  TextureChannelClass TVar1;
  TextureFormat TVar2;
  string *extraout_RAX;
  char *pcVar3;
  char *pcVar4;
  
  TVar2 = ::vk::mapVkFormat((VkFormat)this);
  TVar1 = tcu::getTextureChannelClass(TVar2.type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "vec4";
    pcVar3 = "";
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "ivec4";
    pcVar3 = "";
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "uvec4";
    pcVar3 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "";
    pcVar4 = pcVar3;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return extraout_RAX;
}

Assistant:

std::string getAttachmentType (VkFormat vkFormat)
{
	const tcu::TextureFormat		format			= mapVkFormat(vkFormat);
	const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return "ivec4";

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return "uvec4";

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			return "vec4";

		default:
			DE_FATAL("Unknown channel class");
			return "";
	}
}